

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::checkShortUnits(string *unit_string,uint64_t match_flags)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  undefined1 *puVar8;
  char U;
  char U_00;
  precise_unit pVar9;
  string local_120;
  string local_100;
  int local_dc;
  double local_d8;
  double dStack_d0;
  undefined1 auStack_c8 [8];
  precise_unit retunit_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_1;
  undefined1 auStack_88 [8];
  precise_unit retunit;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str;
  size_type fndPn;
  size_type fndM;
  size_type fndP;
  size_type fndNS;
  bool mod;
  uint64_t match_flags_local;
  string *unit_string_local;
  
  bVar1 = 0;
  std::__cxx11::string::find_first_not_of((char *)unit_string,0x1c8702);
  fndM = std::__cxx11::string::find_first_of((char *)unit_string,0x1c8702);
  lVar4 = std::__cxx11::string::find_first_of((char *)unit_string,0x1cdb6c);
  if ((((fndM == 2) && (uVar5 = std::__cxx11::string::size(), 4 < uVar5)) &&
      (str.field_2._8_8_ = std::__cxx11::string::find_first_not_of((char *)unit_string,0x1c8702),
      str.field_2._8_8_ != -1)) &&
     ((pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string), *pcVar6 != '(' &&
      (lVar4 == -1)))) {
    std::__cxx11::string::substr((ulong)local_68,(ulong)unit_string);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,"fl");
    if (bVar2) {
      pVar9 = get_unit((string *)local_68,match_flags);
      retunit.multiplier_ = pVar9._8_8_;
      auStack_88 = (undefined1  [8])pVar9.multiplier_;
      bVar2 = is_valid((precise_unit *)auStack_88);
      if (bVar2) {
        puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
        *puVar8 = 0x5f;
        pVar9 = get_unit(unit_string,match_flags);
        retunit.multiplier_ = pVar9._8_8_;
        auStack_88 = (undefined1  [8])pVar9.multiplier_;
        bVar2 = is_valid((precise_unit *)auStack_88);
        if (!bVar2) {
          puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
          *puVar8 = 0x2a;
        }
        fndM = std::__cxx11::string::find_first_of((char *)unit_string,0x1c8702);
        bVar1 = 1;
      }
    }
    std::__cxx11::string::~string((string *)local_68);
  }
  while (fndM != 0xffffffffffffffff) {
    lVar7 = std::__cxx11::string::size();
    if (fndM + 2 == lVar7) {
      if (lVar4 == -1) {
        std::__cxx11::string::substr((ulong)&retunit_1.base_units_,(ulong)unit_string);
        pVar9 = get_unit((string *)&retunit_1.base_units_,match_flags);
        retunit_1.multiplier_ = pVar9._8_8_;
        auStack_c8 = (undefined1  [8])pVar9.multiplier_;
        bVar2 = is_valid((precise_unit *)auStack_c8);
        if (bVar2) {
          puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
          *puVar8 = 0x5f;
          pVar9 = get_unit(unit_string,match_flags);
          dStack_d0 = pVar9._8_8_;
          local_d8 = pVar9.multiplier_;
          auStack_c8 = (undefined1  [8])local_d8;
          retunit_1.multiplier_ = dStack_d0;
          bVar2 = is_valid((precise_unit *)auStack_c8);
          if (!bVar2) {
            puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)unit_string);
            *puVar8 = 0x2a;
          }
          local_dc = 1;
          unit_string_local._7_1_ = bVar1;
        }
        else {
          local_dc = 0;
        }
        std::__cxx11::string::~string((string *)&retunit_1.base_units_);
        bVar1 = unit_string_local._7_1_;
        if (local_dc != 0) break;
      }
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      shortStringReplacement_abi_cxx11_(&local_100,(units *)(ulong)(uint)(int)*pcVar6,U);
      std::__cxx11::string::replace((ulong)unit_string,fndM + 1,(string *)0x1);
      std::__cxx11::string::~string((string *)&local_100);
      bVar1 = 1;
    }
    else {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
      iVar3 = (int)*pcVar6;
      if (((iVar3 == 0x20) || (iVar3 == 0x2a)) || ((iVar3 - 0x2eU < 2 || (iVar3 == 0x5e)))) {
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        shortStringReplacement_abi_cxx11_(&local_120,(units *)(ulong)(uint)(int)*pcVar6,U_00);
        std::__cxx11::string::replace((ulong)unit_string,fndM + 1,(string *)0x1);
        std::__cxx11::string::~string((string *)&local_120);
        bVar1 = 1;
      }
    }
    fndM = std::__cxx11::string::find_first_of((char *)unit_string,0x1c8702);
  }
  unit_string_local._7_1_ = bVar1;
  return (bool)(unit_string_local._7_1_ & 1);
}

Assistant:

static bool checkShortUnits(std::string& unit_string, std::uint64_t match_flags)
{
    bool mod = false;
    auto fndNS = unit_string.find_first_not_of(" \t");
    auto fndP = unit_string.find_first_of(" \t", fndNS + 1);
    auto fndM = unit_string.find_first_of("*/");
    if (fndP == 2) {
        if (unit_string.size() > 4) {
            // the single character section next will catch 4 character string
            // issues
            auto fndPn = unit_string.find_first_not_of(" \t", fndP);

            if (fndPn != std::string::npos && unit_string[fndPn] != '(' &&
                fndM == std::string::npos) {
                auto str = unit_string.substr(0, 2);
                if (str != "fl") {
                    auto retunit = get_unit(str, match_flags);
                    if (is_valid(retunit)) {
                        unit_string[2] = '_';
                        retunit = get_unit(unit_string, match_flags);
                        if (!is_valid(retunit)) {
                            unit_string[2] = '*';
                        }
                        fndP = unit_string.find_first_of(" \t", 3);
                        mod = true;
                    }
                }
            }
        }
    }
    while (fndP != std::string::npos) {
        if (fndP + 2 == unit_string.size()) {
            // we are at the end of the string
            if (fndM == std::string::npos) {
                auto str = unit_string.substr(0, fndP);
                auto retunit = get_unit(str, match_flags);
                if (is_valid(retunit)) {
                    unit_string[fndP] = '_';
                    retunit = get_unit(unit_string, match_flags);
                    if (!is_valid(retunit)) {
                        unit_string[fndP] = '*';
                    }
                    return mod;
                }
            }
            unit_string.replace(
                fndP + 1, 1, shortStringReplacement(unit_string[fndP + 1]));
            mod = true;
        } else {
            switch (unit_string[fndP + 1]) {
                case ' ':
                case '*':
                case '/':
                case '^':
                case '.':
                    unit_string.replace(
                        fndP + 1,
                        1,
                        shortStringReplacement(unit_string[fndP + 1]));
                    mod = true;
                    break;
                default:
                    break;
            }
        }
        fndP = unit_string.find_first_of(" \t", fndP + 1);
    }
    return mod;
}